

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckBlackList.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckBlackList(Parser *this,char *filename)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  char *__s;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  size_t pos;
  ulong uVar12;
  ulong uVar13;
  string blackword;
  ifstream file;
  undefined1 *local_260;
  ulong local_258;
  undefined1 local_250 [16];
  string *local_240;
  value_type local_238 [9];
  
  this->m_TestsDone[0x18] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->m_TestsDescription + 0x18),0,
             (char *)this->m_TestsDescription[0x18]._M_string_length,0x178b26);
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x18));
  iVar7 = strcmp((this->m_BlackList)._M_dataplus._M_p,filename);
  if (iVar7 != 0) {
    std::ifstream::ifstream(local_238);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)filename);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot open file: ",0x12);
      if (filename == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar9 = strlen(filename);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,filename,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    else {
      std::istream::seekg((long)local_238,_S_beg);
      lVar8 = std::istream::tellg();
      std::istream::seekg((long)local_238,_S_beg);
      __s = (char *)operator_new__(lVar8 + 1);
      std::istream::read((char *)local_238,(long)__s);
      __s[lVar8] = '\0';
      pcVar3 = (char *)(this->m_BlackListBuffer)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->m_BlackListBuffer,0,pcVar3,(ulong)__s);
      std::__cxx11::string::resize((ulong)&this->m_BlackListBuffer,(char)lVar8);
      operator_delete__(__s);
      pcVar3 = (char *)(this->m_BlackList)._M_string_length;
      strlen(filename);
      std::__cxx11::string::_M_replace((ulong)&this->m_BlackList,0,pcVar3,(ulong)filename);
      std::ifstream::close();
    }
    std::ifstream::~ifstream(local_238);
    if (cVar4 == '\0') {
      return false;
    }
  }
  psVar1 = &this->m_BlackListBuffer;
  uVar10 = std::__cxx11::string::find((char *)psVar1,0x178a26,0);
  uVar11 = std::__cxx11::string::find((char *)psVar1,0x16b512,0);
  if (uVar11 < uVar10) {
    uVar10 = uVar11 - 1;
  }
  uVar13 = uVar11 - 1;
  if (uVar10 != 0xffffffffffffffff) {
    uVar13 = uVar10;
  }
  if (uVar11 == 0xffffffffffffffff) {
    uVar13 = uVar10;
  }
  bVar6 = true;
  if (1 < uVar13 + 1) {
    paVar2 = &local_238[0].description.field_2;
    bVar5 = 0;
    local_240 = psVar1;
    do {
      psVar1 = local_240;
      std::__cxx11::string::substr((ulong)&local_260,(ulong)local_240);
      uVar12 = uVar13 + 1;
      uVar10 = std::__cxx11::string::find((char *)psVar1,0x178a26,uVar12);
      uVar11 = std::__cxx11::string::find((char *)psVar1,0x16b512,uVar12);
      if (uVar11 < uVar10) {
        uVar10 = uVar11 - 1;
      }
      uVar13 = uVar11 - 1;
      if (uVar10 != 0xffffffffffffffff) {
        uVar13 = uVar10;
      }
      if (uVar11 == 0xffffffffffffffff) {
        uVar13 = uVar10;
      }
      if (1 < local_258) {
        pos = std::__cxx11::string::find((char *)&this->m_BufferNoComment,(ulong)local_260,0);
        if (pos != 0xffffffffffffffff) {
          do {
            local_238[0].description._M_string_length = 0;
            local_238[0].description.field_2._M_local_buf[0] = '\0';
            local_238[0].description._M_dataplus._M_p = (pointer)paVar2;
            local_238[0].line = GetLineNumber(this,pos,true);
            local_238[0].number = 0x18;
            local_238[0].line2 = local_238[0].line;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_238[0].description,0,
                       (char *)local_238[0].description._M_string_length,0x178b55);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,local_238);
            pos = std::__cxx11::string::find
                            ((char *)&this->m_BufferNoComment,(ulong)local_260,pos + 1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].description._M_dataplus._M_p != paVar2) {
              operator_delete(local_238[0].description._M_dataplus._M_p);
            }
          } while (pos != 0xffffffffffffffff);
          bVar5 = 1;
        }
      }
      if (local_260 != local_250) {
        operator_delete(local_260);
      }
    } while ((uVar13 != 0xffffffffffffffff) && (uVar12 < uVar13));
    bVar6 = (bool)(bVar5 ^ 1);
  }
  return bVar6;
}

Assistant:

bool Parser::CheckBlackList(const char* filename)
{
  m_TestsDone[BLACKLIST] = true;
  m_TestsDescription[BLACKLIST] = "No word should match any words from the file: ";
  m_TestsDescription[BLACKLIST] += filename;

  bool hasError = false;

  // If the black list is not read we read it
  if(strcmp(m_BlackList.c_str(),filename))
    {
    // Read the file
    std::ifstream file;
    file.open(filename, std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open file: " << filename << std::endl;
      return false;
      }
    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0; 
    m_BlackListBuffer = buf;
    m_BlackListBuffer.resize(fileSize);
    delete [] buf;
    m_BlackList = filename;
    file.close();
    }

  // Go through the list of words
  size_t start = 0;
  size_t space = m_BlackListBuffer.find(" ",start);
  size_t eol = m_BlackListBuffer.find("\n",start);

  size_t end = space;
  if(eol != std::string::npos && eol < space)
    {
    if(eol == 0)
      {
      end = std::string::npos;
      }
    else
      {
      end = eol-1;
      }
    }

  if(end == std::string::npos && eol != std::string::npos)
    {
    if(eol == 0)
      {
      end = std::string::npos;
      }
    else
      {
      end = eol-1;
      }
    }

  while(end != std::string::npos && end>start)
    {
    std::string blackword = m_BlackListBuffer.substr(start,end-start);
    start = end+1;
    
    space = m_BlackListBuffer.find(" ",start);
    eol = m_BlackListBuffer.find("\n",start);

    end = space;
    if(eol != std::string::npos && eol < space)
      {
      if(eol == 0)
        {
        end = std::string::npos;
        }
      else
        {
        end = eol-1;
        }
      }
    if(end == std::string::npos && eol != std::string::npos)
      {
      if(eol == 0)
        {
        end = std::string::npos;
        }
      else
        {
        end = eol-1;
        }
      }

    if(blackword.length() <= 1)
      {
      continue;
      }

    size_t pos = m_BufferNoComment.find(blackword,0);
    while(pos != std::string::npos)
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = BLACKLIST;
      error.description = "The word is in the black list";
      m_ErrorList.push_back(error);
      hasError = true;
      pos = m_BufferNoComment.find(blackword,pos+1);
      }
    }
  return !hasError;
}